

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void init_mbmi(MB_MODE_INFO *mbmi,PREDICTION_MODE curr_mode,MV_REFERENCE_FRAME *ref_frames,
              AV1_COMMON *cm)

{
  InterpFilter IVar1;
  
  mbmi->field_0xa7 = mbmi->field_0xa7 & 0xcf;
  mbmi->mode = curr_mode;
  mbmi->uv_mode = '\0';
  mbmi->ref_frame[0] = *ref_frames;
  mbmi->ref_frame[1] = ref_frames[1];
  (mbmi->palette_mode_info).palette_size[0] = '\0';
  (mbmi->palette_mode_info).palette_size[1] = '\0';
  (mbmi->filter_intra_mode_info).use_filter_intra = '\0';
  mbmi->mv[0] = (int_mv)0x0;
  mbmi->mv[1] = (int_mv)0x0;
  mbmi->motion_mode = '\0';
  mbmi->interintra_mode = 0xff;
  IVar1 = (cm->features).interp_filter;
  if (IVar1 == MULTITAP_SHARP2) {
    IVar1 = EIGHTTAP_REGULAR;
  }
  (mbmi->interp_filters).as_int = (uint)IVar1 * 0x10001;
  return;
}

Assistant:

static inline void init_mbmi(MB_MODE_INFO *mbmi, PREDICTION_MODE curr_mode,
                             const MV_REFERENCE_FRAME *ref_frames,
                             const AV1_COMMON *cm) {
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  mbmi->ref_mv_idx = 0;
  mbmi->mode = curr_mode;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = ref_frames[0];
  mbmi->ref_frame[1] = ref_frames[1];
  pmi->palette_size[0] = 0;
  pmi->palette_size[1] = 0;
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  mbmi->mv[0].as_int = mbmi->mv[1].as_int = 0;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->interintra_mode = (INTERINTRA_MODE)(II_DC_PRED - 1);
  set_default_interp_filters(mbmi, cm->features.interp_filter);
}